

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O2

void __thiscall
duckdb::GraphemeIterator::GraphemeClusterIterator::Next(GraphemeClusterIterator *this)

{
  ulong cpos;
  size_t sVar1;
  runtime_error *this_00;
  
  if (this->s != (char *)0x0) {
    cpos = (this->cluster).end;
    if (cpos < this->len) {
      sVar1 = Utf8Proc::NextGraphemeCluster(this->s,this->len,cpos);
      (this->cluster).start = (this->cluster).end;
      (this->cluster).end = sVar1;
    }
    else {
      (this->cluster).start = 0;
      (this->cluster).end = 0;
      this->s = (char *)0x0;
      this->len = 0;
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_00,"Grapheme cluster out of bounds!");
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void GraphemeIterator::GraphemeClusterIterator::Next() {
	if (IsInvalid()) {
		throw std::runtime_error("Grapheme cluster out of bounds!");
	}
	if (cluster.end >= len) {
		// out of bounds
		SetInvalid();
		return;
	}
	size_t next_pos = Utf8Proc::NextGraphemeCluster(s, len, cluster.end);
	cluster.start = cluster.end;
	cluster.end = next_pos;
}